

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O2

void __thiscall juzzlin::SimpleLogger::Impl::prefixWithTimestamp(Impl *this)

{
  long lVar1;
  tm *__tp;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar2;
  ostream *poVar3;
  Impl *in_RSI;
  char *pcVar4;
  string *this_00;
  string timestamp;
  array<char,_64UL> datetimeBuffer;
  string local_1b0;
  time_t timeTNow;
  string local_188 [11];
  
  timestamp._M_dataplus._M_p = (pointer)&timestamp.field_2;
  timestamp._M_string_length = 0;
  timestamp.field_2._M_local_buf[0] = '\0';
  switch(m_timestampMode) {
  case 1:
    tVar2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    pcVar4 = "%a %b %e %H:%M:%S %Y";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&datetimeBuffer,"%a %b %e %H:%M:%S %Y",(allocator<char> *)&local_1b0);
    currentDateTime(local_188,(Impl *)pcVar4,tVar2,(string *)&datetimeBuffer);
    goto LAB_00105c06;
  case 2:
    lVar1 = std::chrono::_V2::system_clock::now();
    std::__cxx11::to_string(local_188,lVar1 / 1000000000);
    break;
  case 3:
    lVar1 = std::chrono::_V2::system_clock::now();
    std::__cxx11::to_string(local_188,lVar1 / 1000000);
    break;
  case 4:
    lVar1 = std::chrono::_V2::system_clock::now();
    std::__cxx11::to_string(local_188,lVar1 / 1000);
    break;
  case 5:
    tVar2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    pcVar4 = "%Y-%m-%dT%H:%M:%S";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&datetimeBuffer,"%Y-%m-%dT%H:%M:%S",(allocator<char> *)&local_1b0);
    currentDateTime(local_188,(Impl *)pcVar4,tVar2,(string *)&datetimeBuffer);
LAB_00105c06:
    std::__cxx11::string::operator=((string *)&timestamp,(string *)local_188);
    std::__cxx11::string::~string((string *)local_188);
    this_00 = (string *)&datetimeBuffer;
    goto LAB_00105d9b;
  case 6:
    lVar1 = std::chrono::_V2::system_clock::now();
    timeTNow = lVar1 / 1000000000;
    __tp = localtime(&timeTNow);
    strftime(datetimeBuffer._M_elems,0x40,"%Y-%m-%dT%H:%M:%S",__tp);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    poVar3 = std::operator<<((ostream *)local_188,datetimeBuffer._M_elems);
    poVar3 = std::operator<<(poVar3,'.');
    poVar3 = std::operator<<(poVar3,0x30);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
    std::ostream::_M_insert<long>((long)poVar3);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
    this_00 = &local_1b0;
    goto LAB_00105d90;
  case 7:
    tVar2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    currentDateTime(local_188,in_RSI,tVar2,(string *)&m_customTimestampFormat_abi_cxx11_);
    break;
  default:
    goto switchD_00105b9c_default;
  }
  this_00 = local_188;
LAB_00105d90:
  std::__cxx11::string::operator=((string *)&timestamp,(string *)this_00);
LAB_00105d9b:
  std::__cxx11::string::~string((string *)this_00);
  if (timestamp._M_string_length != 0) {
    poVar3 = std::operator<<((ostream *)&this->m_message,(string *)&timestamp);
    std::operator<<(poVar3,(string *)m_timestampSeparator_abi_cxx11_);
  }
switchD_00105b9c_default:
  std::__cxx11::string::~string((string *)&timestamp);
  return;
}

Assistant:

void SimpleLogger::Impl::setTimestampMode(TimestampMode timestampMode)
{
    m_timestampMode = timestampMode;
}